

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteAmbienttLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  ostream *poVar4;
  
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<ambient>");
  psVar3 = &this->endstr;
  std::operator<<(poVar4,(string *)psVar3);
  PushTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"<color sid=\"color\">");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorAmbient).r);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorAmbient).g);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(light->mColorAmbient).b);
  poVar4 = std::operator<<(poVar4,"</color>");
  std::operator<<(poVar4,(string *)psVar3);
  PopTag(this);
  poVar4 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar4 = std::operator<<(poVar4,"</ambient>");
  std::operator<<(poVar4,(string *)psVar3);
  return;
}

Assistant:

void ColladaExporter::WriteAmbienttLight(const aiLight *const light){

    const aiColor3D &color=  light->mColorAmbient;
    mOutput << startstr << "<ambient>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;

    PopTag();
    mOutput << startstr << "</ambient>" << endstr;
}